

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

float * stbi__hdr_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  bool bVar1;
  stbi_uc sVar2;
  stbi_uc sVar3;
  stbi_uc sVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  float *output;
  stbi_uc *__ptr;
  byte *pbVar10;
  stbi_uc *psVar11;
  long lVar12;
  int c;
  int iVar13;
  uint a;
  uint uVar14;
  float *output_00;
  stbi_uc *psVar15;
  long in_FS_OFFSET;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  stbi_uc rgbe [4];
  stbi_uc rgbe_1 [4];
  char buffer [1024];
  char *local_498;
  float *local_490;
  stbi_uc *local_488;
  long local_480;
  ulong local_478;
  ulong local_470;
  ulong local_468;
  long local_460;
  ulong local_458;
  ulong local_450;
  long local_448;
  stbi_uc local_440;
  stbi_uc local_43f;
  stbi_uc local_43e;
  stbi_uc local_43d;
  stbi_uc local_43c [4];
  char local_438;
  char cStack_437;
  char cStack_436;
  char cStack_435;
  char cStack_434;
  char cStack_433;
  char cStack_432;
  char cStack_431;
  char cStack_430;
  char cStack_42f;
  char cStack_42e;
  char cStack_42d;
  char cStack_42c;
  char cStack_42b;
  char cStack_42a;
  char cStack_429;
  char cStack_428;
  char cStack_427;
  char cStack_426;
  char cStack_425;
  char cStack_424;
  char cStack_423;
  char cStack_422;
  
  iVar13 = req_comp;
  stbi__hdr_gettoken(s,&local_438);
  if ((CONCAT17(cStack_42e,
                CONCAT16(cStack_42f,
                         CONCAT15(cStack_430,
                                  CONCAT14(cStack_431,
                                           CONCAT13(cStack_432,
                                                    CONCAT12(cStack_433,
                                                             CONCAT11(cStack_434,cStack_435)))))))
       == 0x45434e41494441 &&
       CONCAT17(cStack_431,
                CONCAT16(cStack_432,
                         CONCAT15(cStack_433,
                                  CONCAT14(cStack_434,
                                           CONCAT13(cStack_435,
                                                    CONCAT12(cStack_436,
                                                             CONCAT11(cStack_437,local_438))))))) ==
       0x4e41494441523f23) ||
     (CONCAT13(cStack_432,CONCAT12(cStack_433,CONCAT11(cStack_434,cStack_435))) == 0x454247 &&
      CONCAT13(cStack_435,CONCAT12(cStack_436,CONCAT11(cStack_437,local_438))) == 0x47523f23)) {
    stbi__hdr_gettoken(s,&local_438);
    if (local_438 != '\0') {
      bVar1 = false;
      do {
        auVar16[0] = -(cStack_431 == '3');
        auVar16[1] = -(cStack_430 == '2');
        auVar16[2] = -(cStack_42f == '-');
        auVar16[3] = -(cStack_42e == 'b');
        auVar16[4] = -(cStack_42d == 'i');
        auVar16[5] = -(cStack_42c == 't');
        auVar16[6] = -(cStack_42b == '_');
        auVar16[7] = -(cStack_42a == 'r');
        auVar16[8] = -(cStack_429 == 'l');
        auVar16[9] = -(cStack_428 == 'e');
        auVar16[10] = -(cStack_427 == '_');
        auVar16[0xb] = -(cStack_426 == 'r');
        auVar16[0xc] = -(cStack_425 == 'g');
        auVar16[0xd] = -(cStack_424 == 'b');
        auVar16[0xe] = -(cStack_423 == 'e');
        auVar16[0xf] = -(cStack_422 == '\0');
        auVar17[0] = -(local_438 == 'F');
        auVar17[1] = -(cStack_437 == 'O');
        auVar17[2] = -(cStack_436 == 'R');
        auVar17[3] = -(cStack_435 == 'M');
        auVar17[4] = -(cStack_434 == 'A');
        auVar17[5] = -(cStack_433 == 'T');
        auVar17[6] = -(cStack_432 == '=');
        auVar17[7] = -(cStack_431 == '3');
        auVar17[8] = -(cStack_430 == '2');
        auVar17[9] = -(cStack_42f == '-');
        auVar17[10] = -(cStack_42e == 'b');
        auVar17[0xb] = -(cStack_42d == 'i');
        auVar17[0xc] = -(cStack_42c == 't');
        auVar17[0xd] = -(cStack_42b == '_');
        auVar17[0xe] = -(cStack_42a == 'r');
        auVar17[0xf] = -(cStack_429 == 'l');
        auVar17 = auVar17 & auVar16;
        if ((ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar17[0xf] >> 7) << 0xf) == 0xffff) {
          bVar1 = true;
        }
        stbi__hdr_gettoken(s,&local_438);
      } while (local_438 != '\0');
      if (bVar1) {
        local_498 = &local_438;
        stbi__hdr_gettoken(s,&local_438);
        if (cStack_436 == ' ' && CONCAT11(cStack_437,local_438) == 0x592d) {
          local_498 = &cStack_435;
          uVar8 = strtol(local_498,&local_498,10);
          local_498 = local_498 + -1;
          do {
            pcVar7 = local_498;
            local_498 = pcVar7 + 1;
          } while (pcVar7[1] == ' ');
          iVar5 = strncmp(local_498,"+X ",3);
          if (iVar5 == 0) {
            local_498 = pcVar7 + 4;
            uVar9 = strtol(local_498,(char **)0x0,10);
            iVar5 = (int)uVar8;
            if ((iVar5 < 0x1000001) && (a = (uint)uVar9, (int)a < 0x1000001)) {
              *x = a;
              *y = iVar5;
              if (comp != (int *)0x0) {
                *comp = 3;
              }
              c = 3;
              if (req_comp != 0) {
                c = req_comp;
              }
              iVar6 = stbi__mad4sizes_valid(a,iVar5,c,4,iVar13);
              if (iVar6 != 0) {
                output = (float *)stbi__malloc_mad4(a,iVar5,c,4,iVar13);
                if (output != (float *)0x0) {
                  iVar13 = 0;
                  local_478 = uVar8;
                  if (a - 0x8000 < 0xffff8008) goto LAB_001185d5;
                  if (iVar5 < 1) {
                    __ptr = (stbi_uc *)0x0;
                  }
                  else {
                    local_450 = (ulong)(a * 4);
                    local_468 = uVar8 & 0x7fffffff;
                    local_470 = uVar9 & 0x7fffffff;
                    local_460 = (uVar9 & 0xffffffff) * (long)c * 4;
                    local_448 = (long)c << 2;
                    uVar8 = 0;
                    __ptr = (stbi_uc *)0x0;
                    local_490 = output;
                    do {
                      local_458 = uVar8;
                      sVar2 = stbi__get8(s);
                      sVar3 = stbi__get8(s);
                      sVar4 = stbi__get8(s);
                      if (((sVar2 != '\x02') || (sVar3 != '\x02')) || ((char)sVar4 < '\0')) {
                        local_440 = sVar2;
                        local_43f = sVar3;
                        local_43e = sVar4;
                        local_43d = stbi__get8(s);
                        stbi__hdr_convert(output,&local_440,c);
                        free(__ptr);
                        iVar13 = 0;
                        iVar5 = 1;
                        do {
                          stbi__getn(s,local_43c,4);
                          stbi__hdr_convert(output + (long)(int)(c * a * iVar13) + (long)(iVar5 * c)
                                            ,local_43c,c);
                          iVar5 = iVar5 + 1;
                          while ((int)a <= iVar5) {
                            iVar13 = iVar13 + 1;
LAB_001185d5:
                            iVar5 = 0;
                            if ((int)local_478 <= iVar13) {
                              return output;
                            }
                          }
                        } while( true );
                      }
                      sVar2 = stbi__get8(s);
                      if (CONCAT11(sVar4,sVar2) != a) {
                        free(output);
                        free(__ptr);
                        pcVar7 = "invalid decoded scanline length";
                        goto LAB_0011819d;
                      }
                      if ((__ptr == (stbi_uc *)0x0) &&
                         (__ptr = (stbi_uc *)malloc(local_450), __ptr == (stbi_uc *)0x0)) {
                        free(output);
                        goto LAB_001185c7;
                      }
                      local_480 = 0;
                      local_488 = __ptr;
                      do {
                        if (0 < (int)a) {
                          iVar13 = 0;
                          uVar8 = uVar9 & 0xffffffff;
                          do {
                            pbVar10 = s->img_buffer;
                            if (pbVar10 < s->img_buffer_end) {
LAB_00118394:
                              s->img_buffer = pbVar10 + 1;
                              uVar14 = (uint)*pbVar10;
                            }
                            else {
                              if (s->read_from_callbacks != 0) {
                                stbi__refill_buffer(s);
                                pbVar10 = s->img_buffer;
                                goto LAB_00118394;
                              }
                              uVar14 = 0;
                            }
                            psVar15 = local_488;
                            if ((byte)uVar14 < 0x81) {
                              if ((uVar14 == 0) || ((uint)uVar8 < uVar14)) goto LAB_00118530;
                              lVar12 = 0;
                              do {
                                psVar11 = s->img_buffer;
                                if (psVar11 < s->img_buffer_end) {
LAB_00118463:
                                  s->img_buffer = psVar11 + 1;
                                  sVar2 = *psVar11;
                                }
                                else {
                                  if (s->read_from_callbacks != 0) {
                                    stbi__refill_buffer(s);
                                    psVar11 = s->img_buffer;
                                    goto LAB_00118463;
                                  }
                                  sVar2 = '\0';
                                }
                                psVar15[lVar12 * 4 + (long)iVar13 * 4] = sVar2;
                                lVar12 = lVar12 + 1;
                              } while (uVar14 != (uint)lVar12);
                              iVar13 = iVar13 + (uint)lVar12;
                            }
                            else {
                              psVar15 = s->img_buffer;
                              if (psVar15 < s->img_buffer_end) {
LAB_001183d5:
                                s->img_buffer = psVar15 + 1;
                                sVar2 = *psVar15;
                              }
                              else {
                                if (s->read_from_callbacks != 0) {
                                  stbi__refill_buffer(s);
                                  psVar15 = s->img_buffer;
                                  goto LAB_001183d5;
                                }
                                sVar2 = '\0';
                              }
                              if ((uint)uVar8 < (uVar14 & 0x7f)) {
LAB_00118530:
                                free(output);
                                free(__ptr);
                                pcVar7 = "corrupt";
                                goto LAB_0011819d;
                              }
                              if ((uVar14 & 0x7f) != 0) {
                                lVar12 = 0;
                                do {
                                  local_488[lVar12 * 4 + (long)iVar13 * 4] = sVar2;
                                  lVar12 = lVar12 + 1;
                                } while ((uVar14 & 0x7f) != (uint)lVar12);
                                iVar13 = iVar13 + (uint)lVar12;
                              }
                            }
                            uVar8 = (ulong)(a - iVar13);
                          } while (a - iVar13 != 0 && iVar13 <= (int)a);
                        }
                        local_480 = local_480 + 1;
                        local_488 = local_488 + 1;
                      } while (local_480 != 4);
                      local_480 = 4;
                      uVar8 = local_470;
                      output_00 = local_490;
                      psVar15 = __ptr;
                      if (0 < (int)a) {
                        do {
                          stbi__hdr_convert(output_00,psVar15,c);
                          output_00 = (float *)((long)output_00 + local_448);
                          psVar15 = psVar15 + 4;
                          uVar8 = uVar8 - 1;
                        } while (uVar8 != 0);
                      }
                      uVar8 = local_458 + 1;
                      local_490 = (float *)((long)local_490 + local_460);
                    } while (uVar8 != local_468);
                  }
                  if (__ptr == (stbi_uc *)0x0) {
                    return output;
                  }
                  free(__ptr);
                  return output;
                }
LAB_001185c7:
                pcVar7 = "outofmem";
                goto LAB_0011819d;
              }
            }
            pcVar7 = "too large";
            goto LAB_0011819d;
          }
        }
        pcVar7 = "unsupported data layout";
        goto LAB_0011819d;
      }
    }
    pcVar7 = "unsupported format";
  }
  else {
    pcVar7 = "not HDR";
  }
LAB_0011819d:
  *(char **)(in_FS_OFFSET + -0x20) = pcVar7;
  return (float *)0x0;
}

Assistant:

static float *stbi__hdr_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   char buffer[STBI__HDR_BUFLEN];
   char *token;
   int valid = 0;
   int width, height;
   stbi_uc *scanline;
   float *hdr_data;
   int len;
   unsigned char count, value;
   int i, j, k, c1,c2, z;
   const char *headerToken;
   STBI_NOTUSED(ri);

   // Check identifier
   headerToken = stbi__hdr_gettoken(s,buffer);
   if (strcmp(headerToken, "#?RADIANCE") != 0 && strcmp(headerToken, "#?RGBE") != 0)
      return stbi__errpf("not HDR", "Corrupt HDR image");

   // Parse header
   for(;;) {
      token = stbi__hdr_gettoken(s,buffer);
      if (token[0] == 0) break;
      if (strcmp(token, "FORMAT=32-bit_rle_rgbe") == 0) valid = 1;
   }

   if (!valid)    return stbi__errpf("unsupported format", "Unsupported HDR format");

   // Parse width and height
   // can't use sscanf() if we're not using stdio!
   token = stbi__hdr_gettoken(s,buffer);
   if (strncmp(token, "-Y ", 3))  return stbi__errpf("unsupported data layout", "Unsupported HDR format");
   token += 3;
   height = (int) strtol(token, &token, 10);
   while (*token == ' ') ++token;
   if (strncmp(token, "+X ", 3))  return stbi__errpf("unsupported data layout", "Unsupported HDR format");
   token += 3;
   width = (int) strtol(token, NULL, 10);

   if (height > STBI_MAX_DIMENSIONS) return stbi__errpf("too large","Very large image (corrupt?)");
   if (width > STBI_MAX_DIMENSIONS) return stbi__errpf("too large","Very large image (corrupt?)");

   *x = width;
   *y = height;

   if (comp) *comp = 3;
   if (req_comp == 0) req_comp = 3;

   if (!stbi__mad4sizes_valid(width, height, req_comp, sizeof(float), 0))
      return stbi__errpf("too large", "HDR image is too large");

   // Read data
   hdr_data = (float *) stbi__malloc_mad4(width, height, req_comp, sizeof(float), 0);
   if (!hdr_data)
      return stbi__errpf("outofmem", "Out of memory");

   // Load image data
   // image data is stored as some number of sca
   if ( width < 8 || width >= 32768) {
      // Read flat data
      for (j=0; j < height; ++j) {
         for (i=0; i < width; ++i) {
            stbi_uc rgbe[4];
           main_decode_loop:
            stbi__getn(s, rgbe, 4);
            stbi__hdr_convert(hdr_data + j * width * req_comp + i * req_comp, rgbe, req_comp);
         }
      }
   } else {
      // Read RLE-encoded data
      scanline = NULL;

      for (j = 0; j < height; ++j) {
         c1 = stbi__get8(s);
         c2 = stbi__get8(s);
         len = stbi__get8(s);
         if (c1 != 2 || c2 != 2 || (len & 0x80)) {
            // not run-length encoded, so we have to actually use THIS data as a decoded
            // pixel (note this can't be a valid pixel--one of RGB must be >= 128)
            stbi_uc rgbe[4];
            rgbe[0] = (stbi_uc) c1;
            rgbe[1] = (stbi_uc) c2;
            rgbe[2] = (stbi_uc) len;
            rgbe[3] = (stbi_uc) stbi__get8(s);
            stbi__hdr_convert(hdr_data, rgbe, req_comp);
            i = 1;
            j = 0;
            STBI_FREE(scanline);
            goto main_decode_loop; // yes, this makes no sense
         }
         len <<= 8;
         len |= stbi__get8(s);
         if (len != width) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("invalid decoded scanline length", "corrupt HDR"); }
         if (scanline == NULL) {
            scanline = (stbi_uc *) stbi__malloc_mad2(width, 4, 0);
            if (!scanline) {
               STBI_FREE(hdr_data);
               return stbi__errpf("outofmem", "Out of memory");
            }
         }

         for (k = 0; k < 4; ++k) {
            int nleft;
            i = 0;
            while ((nleft = width - i) > 0) {
               count = stbi__get8(s);
               if (count > 128) {
                  // Run
                  value = stbi__get8(s);
                  count -= 128;
                  if ((count == 0) || (count > nleft)) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("corrupt", "bad RLE data in HDR"); }
                  for (z = 0; z < count; ++z)
                     scanline[i++ * 4 + k] = value;
               } else {
                  // Dump
                  if ((count == 0) || (count > nleft)) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("corrupt", "bad RLE data in HDR"); }
                  for (z = 0; z < count; ++z)
                     scanline[i++ * 4 + k] = stbi__get8(s);
               }
            }
         }
         for (i=0; i < width; ++i)
            stbi__hdr_convert(hdr_data+(j*width + i)*req_comp, scanline + i*4, req_comp);
      }
      if (scanline)
         STBI_FREE(scanline);
   }

   return hdr_data;
}